

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::Login(Character *this)

{
  undefined2 uVar1;
  pointer pcVar2;
  Quest_Context *this_00;
  undefined8 uVar3;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  shared_ptr<Quest_Context> context;
  Quest *quest;
  undefined1 local_71;
  Quest_Context *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Base_ptr local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  CalculateStats(this,false);
  pcVar2 = (this->quest_string)._M_dataplus._M_p;
  local_38._M_allocated_capacity = (size_type)&local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (this->quest_string)._M_string_length);
  QuestUnserialize((string *)&local_38,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_allocated_capacity != &local_28) {
    operator_delete((void *)local_38._M_allocated_capacity,local_28._M_allocated_capacity + 1);
  }
  (this->quest_string)._M_string_length = 0;
  *(this->quest_string)._M_dataplus._M_p = '\0';
  GetQuest((Character *)local_60,(short)this);
  uVar3 = local_60._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    p_Var7 = (this->world->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var7 != (_Base_ptr)0x0) {
      p_Var5 = &(this->world->quests)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var5->_M_header;
      do {
        uVar1 = (undefined2)p_Var7[1]._M_color;
        if (-1 < (short)uVar1) {
          p_Var8 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(ushort)uVar1 >> 0xf];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 != p_Var5) && ((short)p_Var8[1]._M_color < 1)) {
        local_40 = p_Var8[1]._M_parent;
        bVar4 = Quest::Disabled((Quest *)local_40);
        if (!bVar4) {
          local_70 = (element_type *)0x0;
          local_60._0_8_ = this;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Quest_Context,std::allocator<Quest_Context>,Character*,Quest*&>
                    (&local_68,&local_70,(allocator<Quest_Context> *)&local_71,
                     (Character **)local_60,(Quest **)&local_40);
          pmVar6 = std::
                   map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                   ::operator[](&this->quests,(key_type *)(p_Var8 + 1));
          (pmVar6->super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_70;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar6->super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount,&local_68);
          this_00 = local_70;
          local_60._0_8_ = &local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"begin","");
          EOPlus::Context::SetState(&this_00->super_Context,(string *)local_60,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._0_8_ != &local_50) {
            operator_delete((void *)local_60._0_8_,local_50._M_allocated_capacity + 1);
          }
          if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
          }
        }
      }
    }
  }
  this->online = true;
  CalculateStats(this,true);
  return;
}

Assistant:

void Character::Login()
{
	this->CalculateStats(false);

	QuestUnserialize(this->quest_string, this);
	this->quest_string.clear();

	// Start the default 00000.eqf quest
	if (!this->GetQuest(0))
	{
		auto it = this->world->quests.find(0);

		if (it != this->world->quests.end())
		{
			// WARNING: holds a non-tracked reference to shared_ptr
			Quest* quest = it->second.get();

			if (!quest->Disabled())
			{
				auto context = std::make_shared<Quest_Context>(this, quest);
				this->quests[it->first] = context;
				context->SetState("begin");
			}
		}
	}

	this->online = true;

	this->CalculateStats();
}